

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItem::QTreeWidgetItem
          (QTreeWidgetItem *this,QTreeWidget *treeview,QStringList *strings,int type)

{
  long lVar1;
  QFlags<Qt::ItemFlag> QVar2;
  QTreeWidgetItem *this_00;
  QTreeWidget *v;
  qsizetype qVar3;
  QTreeModel *pQVar4;
  int in_ECX;
  QList<QString> *in_RDX;
  QTreeWidgetItem *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  QTreeModel *model;
  int i;
  QTreeWidgetItem *in_stack_ffffffffffffff98;
  enum_type in_stack_ffffffffffffffa0;
  enum_type in_stack_ffffffffffffffa4;
  enum_type eVar5;
  enum_type eVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_00d31678;
  in_RDI->rtti = in_ECX;
  QList<QList<QWidgetItemData>_>::QList((QList<QList<QWidgetItemData>_> *)0x913001);
  in_RDI->view = (QTreeWidget *)0x0;
  this_00 = (QTreeWidgetItem *)operator_new(0x30);
  QTreeWidgetItemPrivate::QTreeWidgetItemPrivate
            ((QTreeWidgetItemPrivate *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
             ,in_stack_ffffffffffffff98);
  in_RDI->d = (QTreeWidgetItemPrivate *)this_00;
  in_RDI->par = (QTreeWidgetItem *)0x0;
  QList<QTreeWidgetItem_*>::QList((QList<QTreeWidgetItem_*> *)0x913049);
  Qt::operator|(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  QFlags<Qt::ItemFlag>::operator|
            ((QFlags<Qt::ItemFlag> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (ItemFlag)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  QFlags<Qt::ItemFlag>::operator|
            ((QFlags<Qt::ItemFlag> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (ItemFlag)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  QVar2 = QFlags<Qt::ItemFlag>::operator|
                    ((QFlags<Qt::ItemFlag> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (ItemFlag)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  (in_RDI->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
       = (Int)QVar2.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  eVar5 = NoItemFlags;
  while( true ) {
    v = (QTreeWidget *)(long)(int)eVar5;
    qVar3 = QList<QString>::size(in_RDX);
    if (qVar3 <= (long)v) break;
    eVar6 = eVar5;
    QList<QString>::at((QList<QString> *)CONCAT44(eVar5,in_stack_ffffffffffffffa0),
                       (qsizetype)in_stack_ffffffffffffff98);
    setText(in_RDI,(int)((ulong)this_00 >> 0x20),(QString *)v);
    in_stack_ffffffffffffffa4 = eVar5;
    eVar5 = eVar6 + ItemIsSelectable;
  }
  pQVar4 = treeModel(this_00,v);
  if (pQVar4 != (QTreeModel *)0x0) {
    addChild((QTreeWidgetItem *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
    columnCount((QTreeWidgetItem *)0x913143);
    QList<QList<QWidgetItemData>_>::reserve
              ((QList<QList<QWidgetItemData>_> *)CONCAT44(in_ECX,eVar5),in_stack_00000008);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidget *treeview, const QStringList &strings, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    for (int i = 0; i < strings.size(); ++i)
        setText(i, strings.at(i));
    // do not set this->view here otherwise insertChild() will fail
    if (QTreeModel *model = treeModel(treeview)) {
        model->rootItem->addChild(this);
        values.reserve(model->headerItem->columnCount());
    }
}